

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O0

void __thiscall sentencepiece::NormalizerSpec::SharedDtor(NormalizerSpec *this)

{
  string *default_value;
  long in_RDI;
  string *in_stack_ffffffffffffff88;
  ArenaStringPtr *in_stack_ffffffffffffff90;
  
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  default_value = (string *)(in_RDI + 0x40);
  google::protobuf::internal::GetEmptyStringAlreadyInited_abi_cxx11_();
  google::protobuf::internal::ArenaStringPtr::DestroyNoArena
            (in_stack_ffffffffffffff90,default_value);
  return;
}

Assistant:

void NormalizerSpec::SharedDtor() {
  GOOGLE_DCHECK(GetArena() == nullptr);
  name_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  precompiled_charsmap_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  normalization_rule_tsv_.DestroyNoArena(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
}